

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

void __thiscall slang::SVInt::initSlowCase(SVInt *this,SVIntStorage *other)

{
  uint64_t *__dest;
  uint uVar1;
  uint uVar2;
  
  uVar2 = (this->super_SVIntStorage).bitWidth + 0x3f;
  uVar1 = (uVar2 >> 6) << ((this->super_SVIntStorage).unknownFlag & 0x1fU);
  __dest = (uint64_t *)operator_new__((ulong)uVar1 * 8);
  (this->super_SVIntStorage).field_0.pVal = __dest;
  if (uVar2 < 0x40) {
    return;
  }
  memmove(__dest,(other->field_0).pVal,(ulong)(uVar1 << 3));
  return;
}

Assistant:

void SVInt::initSlowCase(const SVIntStorage& other) {
    uint32_t words = getNumWords();
    pVal = new uint64_t[words];
    std::ranges::copy(other.pVal, other.pVal + words, pVal);
}